

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebServer.cpp
# Opt level: O1

void __thiscall WebServer::connectionCallback(WebServer *this)

{
  __weak_count<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  size_type *psVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *__dest;
  Channel *this_00;
  element_type *peVar3;
  ushort uVar4;
  int fd;
  int iVar5;
  EventLoop *this_01;
  char *pcVar6;
  uint __val;
  uint __len;
  undefined1 auStack_e8 [8];
  sockaddr_in cliAddr;
  HttpConnPtr httpConn;
  size_type *local_a8;
  string from;
  string __str;
  ulong local_60;
  _func_int **pp_Stack_58;
  EventLoop *local_50;
  uchar local_48 [8];
  element_type *local_40;
  socklen_t local_34 [2];
  socklen_t len;
  
  auStack_e8._0_2_ = 0;
  auStack_e8[2] = '\0';
  auStack_e8[3] = '\0';
  auStack_e8[4] = '\0';
  auStack_e8[5] = '\0';
  auStack_e8[6] = '\0';
  auStack_e8[7] = '\0';
  cliAddr.sin_family = 0;
  cliAddr.sin_port = 0;
  cliAddr.sin_addr.s_addr = 0;
  local_34[0] = 0x10;
  fd = accept(this->listenFd_,(sockaddr *)auStack_e8,local_34);
  if (0 < fd) {
    do {
      this_01 = EventLoopThreadPool::getNextLoop
                          ((this->reactorPool_)._M_t.
                           super___uniq_ptr_impl<EventLoopThreadPool,_std::default_delete<EventLoopThreadPool>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_EventLoopThreadPool_*,_std::default_delete<EventLoopThreadPool>_>
                           .super__Head_base<0UL,_EventLoopThreadPool_*,_false>._M_head_impl);
      if (fd < 100000) {
        pcVar6 = inet_ntoa((in_addr)auStack_e8._4_4_);
        std::__cxx11::string::string
                  ((string *)&local_a8,pcVar6,(allocator *)(from.field_2._M_local_buf + 8));
        std::__cxx11::string::push_back((char)(string *)&local_a8);
        uVar4 = auStack_e8._2_2_ << 8 | (ushort)auStack_e8._2_2_ >> 8;
        __val = (uint)uVar4;
        __len = 1;
        if (((9 < uVar4) && (__len = 2, 99 < uVar4)) && (__len = 3, 999 < __val)) {
          __len = 5 - (__val < 10000);
        }
        from.field_2._8_8_ = &__str._M_string_length;
        std::__cxx11::string::_M_construct((ulong)((long)&from.field_2 + 8),(char)__len);
        std::__detail::__to_chars_10_impl<unsigned_int>((char *)from.field_2._8_8_,__len,__val);
        std::__cxx11::string::_M_append((char *)&local_a8,from.field_2._8_8_);
        psVar2 = &from._M_string_length;
        if ((size_type *)from.field_2._8_8_ != &__str._M_string_length) {
          operator_delete((void *)from.field_2._8_8_);
        }
        iVar5 = setNonBlocking(fd);
        if (iVar5 == -1) {
          __assert_fail("setNonBlocking(connfd) != -1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Raven65[P]WebServer/WebServer.cpp"
                        ,0x66,"void WebServer::connectionCallback()");
        }
        setNodelay(fd);
        HttpConnPool::getNextConn((HttpConnPool *)cliAddr.sin_zero);
        from.field_2._8_8_ = HttpConn::init;
        __str._M_dataplus._M_p = (pointer)0x0;
        if (local_a8 == psVar2) {
          pp_Stack_58 = (_func_int **)from.field_2._M_allocated_capacity;
          __str.field_2._M_allocated_capacity = (size_type)&local_60;
        }
        else {
          __str.field_2._M_allocated_capacity = (size_type)local_a8;
        }
        local_60 = CONCAT71(from._M_string_length._1_7_,(undefined1)from._M_string_length);
        __str.field_2._8_8_ = from._M_dataplus._M_p;
        from._M_dataplus._M_p = (pointer)0x0;
        from._M_string_length._0_1_ = 0;
        local_48[0] = cliAddr.sin_zero[0];
        local_48[1] = cliAddr.sin_zero[1];
        local_48[2] = cliAddr.sin_zero[2];
        local_48[3] = cliAddr.sin_zero[3];
        local_48[4] = cliAddr.sin_zero[4];
        local_48[5] = cliAddr.sin_zero[5];
        local_48[6] = cliAddr.sin_zero[6];
        local_48[7] = cliAddr.sin_zero[7];
        local_40 = httpConn.super___shared_ptr<HttpConn,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if (httpConn.super___shared_ptr<HttpConn,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
            (element_type *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var1 = &((httpConn.super___shared_ptr<HttpConn,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                      super_enable_shared_from_this<HttpConn>)._M_weak_this.
                      super___weak_ptr<HttpConn,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
            *(int *)&p_Var1->_M_pi = *(int *)&p_Var1->_M_pi + 1;
            UNLOCK();
          }
          else {
            p_Var1 = &((httpConn.super___shared_ptr<HttpConn,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                      super_enable_shared_from_this<HttpConn>)._M_weak_this.
                      super___weak_ptr<HttpConn,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
            *(int *)&p_Var1->_M_pi = *(int *)&p_Var1->_M_pi + 1;
          }
        }
        httpConn.super___shared_ptr<HttpConn,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_a8 = psVar2;
        __str._M_string_length._0_4_ = fd;
        local_50 = this_01;
        httpConn.super___shared_ptr<HttpConn,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x50);
        peVar3 = local_40;
        (httpConn.super___shared_ptr<HttpConn,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _vptr__Sp_counted_base = (_func_int **)from.field_2._8_8_;
        *(pointer *)
         &(httpConn.super___shared_ptr<HttpConn,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
          _M_use_count = __str._M_dataplus._M_p;
        *(int *)&httpConn.super___shared_ptr<HttpConn,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                 [1]._vptr__Sp_counted_base = (int)__str._M_string_length;
        *(_Atomic_word **)
         &httpConn.super___shared_ptr<HttpConn,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
          _M_use_count =
             &httpConn.super___shared_ptr<HttpConn,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[2]
              ._M_use_count;
        if ((ulong *)__str.field_2._M_allocated_capacity == &local_60) {
          httpConn.super___shared_ptr<HttpConn,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[2].
          _M_use_count = (undefined4)local_60;
          httpConn.super___shared_ptr<HttpConn,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[2].
          _M_weak_count = local_60._4_4_;
          httpConn.super___shared_ptr<HttpConn,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[3].
          _vptr__Sp_counted_base = pp_Stack_58;
        }
        else {
          httpConn.super___shared_ptr<HttpConn,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
          _M_use_count = __str.field_2._M_allocated_capacity._0_4_;
          httpConn.super___shared_ptr<HttpConn,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
          _M_weak_count = __str.field_2._4_4_;
          httpConn.super___shared_ptr<HttpConn,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[2].
          _M_use_count = (undefined4)local_60;
          httpConn.super___shared_ptr<HttpConn,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[2].
          _M_weak_count = local_60._4_4_;
        }
        httpConn.super___shared_ptr<HttpConn,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[2].
        _vptr__Sp_counted_base = (_func_int **)__str.field_2._8_8_;
        __str.field_2._8_8_ = 0;
        local_60 = local_60 & 0xffffffffffffff00;
        *(EventLoop **)
         &httpConn.super___shared_ptr<HttpConn,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[3].
          _M_use_count = local_50;
        httpConn.super___shared_ptr<HttpConn,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[4].
        _vptr__Sp_counted_base = (_func_int **)local_48;
        httpConn.super___shared_ptr<HttpConn,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[4].
        _M_use_count = 0;
        httpConn.super___shared_ptr<HttpConn,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[4].
        _M_weak_count = 0;
        local_40 = (element_type *)0x0;
        *(element_type **)
         &httpConn.super___shared_ptr<HttpConn,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[4].
          _M_use_count = peVar3;
        local_48[0] = '\0';
        local_48[1] = '\0';
        local_48[2] = '\0';
        local_48[3] = '\0';
        local_48[4] = '\0';
        local_48[5] = '\0';
        local_48[6] = '\0';
        local_48[7] = '\0';
        __str.field_2._M_allocated_capacity = (size_type)&local_60;
        EventLoop::runInLoop
                  (this_01,(Functor *)
                           &httpConn.super___shared_ptr<HttpConn,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
        __dest = &httpConn.super___shared_ptr<HttpConn,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
        std::
        _Function_handler<void_(),_std::_Bind<void_(HttpConn::*(std::shared_ptr<HttpConn>,_EventLoop_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int))(EventLoop_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int)>_>
        ::_M_manager((_Any_data *)__dest,(_Any_data *)__dest,__destroy_functor);
        if (local_40 != (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_40);
        }
        if ((ulong *)__str.field_2._M_allocated_capacity != &local_60) {
          operator_delete((void *)__str.field_2._M_allocated_capacity);
        }
        if (httpConn.super___shared_ptr<HttpConn,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
            (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     httpConn.super___shared_ptr<HttpConn,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        }
        if (local_a8 != psVar2) {
          operator_delete(local_a8);
        }
      }
      else {
        close(fd);
      }
      fd = accept(this->listenFd_,(sockaddr *)auStack_e8,local_34);
    } while (0 < fd);
  }
  this_00 = (this->acceptChannel_).super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  this_00->events_ = -0x7fffffff;
  Channel::update(this_00);
  return;
}

Assistant:

void WebServer::connectionCallback() {
    struct sockaddr_in cliAddr;
    memset(&cliAddr, 0, sizeof(struct sockaddr_in));
    socklen_t len = sizeof(cliAddr);
    int connfd = 0;
    while ((connfd = accept(listenFd_, (struct sockaddr*)&cliAddr, &len)) > 0) {
        EventLoop *loop = reactorPool_->getNextLoop();
        
        // LOG << "New connection from " << inet_ntoa(cliAddr.sin_addr) << ":" << ntohs(cliAddr.sin_port);
        
        if(connfd >= MAXFD) {
            close(connfd);
            continue;
        }
        std::string from(inet_ntoa(cliAddr.sin_addr));
        from.push_back(':');
        from += std::to_string(ntohs(cliAddr.sin_port));

        assert(setNonBlocking(connfd) != -1);
        setNodelay(connfd);
        HttpConnPtr httpConn = connPool_.getNextConn();
        loop->runInLoop(std::bind(&HttpConn::init, httpConn, loop, std::move(from), connfd));
    }

    acceptChannel_->setEvent(EPOLLIN | EPOLLET);
    acceptChannel_->update();
}